

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeinfo.c
# Opt level: O1

bool_t prf_nodeinfo_set(prf_nodeinfo_t *nodeinfo)

{
  ushort uVar1;
  uint uVar2;
  char *__s;
  _func_bool_t_prf_node_t_ptr_prf_state_t_ptr_bfile_t_ptr *p_Var3;
  _func_void_prf_node_t_ptr_prf_state_t_ptr *p_Var4;
  _func_void_prf_node_t_ptr_prf_model_t_ptr *p_Var5;
  prf_nodeinfo_t **pppVar6;
  int iVar7;
  prf_nodeinfo_t *ppVar8;
  size_t sVar9;
  char *__dest;
  
  iVar7 = prf_array_count(nodetypes);
  uVar1 = nodeinfo->opcode;
  if (iVar7 <= (int)(uint)uVar1) {
    iVar7 = iVar7 + -1;
    do {
      nodetypes = (prf_nodeinfo_t **)prf_array_append_ptr(nodetypes,(void *)0x0);
      uVar1 = nodeinfo->opcode;
      iVar7 = iVar7 + 1;
    } while (iVar7 < (int)(uint)uVar1);
  }
  pppVar6 = nodetypes;
  if (nodetypes[uVar1] != (prf_nodeinfo_t *)0x0) {
    free(nodetypes[uVar1]->name);
    free(pppVar6[nodeinfo->opcode]);
  }
  ppVar8 = (prf_nodeinfo_t *)malloc(0x48);
  uVar2._0_2_ = nodeinfo->opcode;
  uVar2._2_2_ = nodeinfo->flags;
  pppVar6[uVar2 & 0xffff] = ppVar8;
  ppVar8->opcode = (undefined2)uVar2;
  ppVar8->flags = uVar2._2_2_;
  p_Var3 = nodeinfo->save_f;
  ppVar8->load_f = nodeinfo->load_f;
  ppVar8->save_f = p_Var3;
  p_Var4 = nodeinfo->exit_f;
  ppVar8->entry_f = nodeinfo->entry_f;
  ppVar8->exit_f = p_Var4;
  p_Var5 = nodeinfo->destroy_f;
  ppVar8->traverse_f = nodeinfo->traverse_f;
  ppVar8->destroy_f = p_Var5;
  ppVar8->clone_f = nodeinfo->clone_f;
  __s = nodeinfo->name;
  sVar9 = strlen(__s);
  __dest = (char *)malloc(sVar9 + 1);
  ppVar8->name = __dest;
  strcpy(__dest,__s);
  return 1;
}

Assistant:

bool_t
prf_nodeinfo_set(const prf_nodeinfo_t * nodeinfo)
{
    int i;
    prf_nodeinfo_t * newnodeinfo;

    assert(nodeinfo->opcode > 0);

    i = prf_array_count(nodetypes);
    while ( i <= nodeinfo->opcode ) {
        nodetypes = (prf_nodeinfo_t **) prf_array_append_ptr(nodetypes, NULL);
        i++;
    }

    if ( nodetypes[nodeinfo->opcode ] != NULL ) {
        assert(nodetypes[nodeinfo->opcode] != nodeinfo);
        free(nodetypes[nodeinfo->opcode]->name);
        free(nodetypes[nodeinfo->opcode]);
    }

    newnodeinfo = (prf_nodeinfo_t *) malloc(sizeof(struct prf_nodeinfo_s));
    assert(newnodeinfo != NULL);
    nodetypes[ nodeinfo->opcode ] = newnodeinfo;
    newnodeinfo->opcode = nodeinfo->opcode;
    newnodeinfo->flags = nodeinfo->flags;
    newnodeinfo->load_f = nodeinfo->load_f;
    newnodeinfo->save_f = nodeinfo->save_f;
    newnodeinfo->entry_f = nodeinfo->entry_f;
    newnodeinfo->exit_f = nodeinfo->exit_f;
    newnodeinfo->traverse_f = nodeinfo->traverse_f;
    newnodeinfo->destroy_f = nodeinfo->destroy_f;
    newnodeinfo->clone_f = nodeinfo->clone_f;
    newnodeinfo->name = (char *) malloc(strlen(nodeinfo->name) + 1);
    assert(newnodeinfo->name != NULL);
    strcpy(newnodeinfo->name, nodeinfo->name);
    
    return TRUE;
}